

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

ssize_t __thiscall LongReadsMapper::write(LongReadsMapper *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  char *pcVar2;
  uint64_t count;
  long local_20;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,__fd);
  std::ostream::write(pcVar2,(long)&this->k);
  std::ostream::write(pcVar2,(long)&this->max_index_freq);
  std::ostream::write(pcVar2,(long)&this->min_size);
  std::ostream::write(pcVar2,(long)&this->min_chain);
  std::ostream::write(pcVar2,(long)&this->max_jump);
  std::ostream::write(pcVar2,(long)&this->max_delta_change);
  local_20 = (long)(this->mappings).
                   super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->mappings).
                   super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5;
  sVar1 = std::ostream::write(pcVar2,(long)&local_20);
  if (local_20 != 0) {
    sVar1 = std::ostream::write(pcVar2,(long)(this->mappings).
                                             super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
  }
  return sVar1;
}

Assistant:

void LongReadsMapper::write(std::ofstream &ofs) {
    ofs.write(reinterpret_cast<const char *>(&k), sizeof(k));
    ofs.write(reinterpret_cast<const char *>(&max_index_freq), sizeof(max_index_freq));
    ofs.write(reinterpret_cast<const char *>(&min_size), sizeof(min_size));
    ofs.write(reinterpret_cast<const char *>(&min_chain), sizeof(min_chain));
    ofs.write(reinterpret_cast<const char *>(&max_jump), sizeof(max_jump));
    ofs.write(reinterpret_cast<const char *>(&max_delta_change), sizeof(max_delta_change));

    sdglib::write_flat_vector(ofs, mappings);
}